

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O0

void why_not_use_auto_pointer(void)

{
  element_type *peVar1;
  ostream *poVar2;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b0;
  int local_cc;
  int i;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pwin;
  auto_ptr local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a2;
  allocator local_a1;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_8a;
  allocator local_89;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_72;
  allocator local_71;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_5e;
  allocator local_5d [13];
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  films [5];
  
  pwin._M_ptr._5_1_ = 1;
  local_40 = &local_38;
  peVar1 = (element_type *)operator_new(0x20);
  local_5e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)peVar1,"The Iron Man",local_5d);
  local_5e = 0;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(&local_50,peVar1);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_50);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(&local_38,
           (auto_ptr_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )local_48);
  local_40 = films;
  peVar1 = (element_type *)operator_new(0x20);
  local_72 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)peVar1,"The amazing four",&local_71);
  local_72 = 0;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(&local_70,peVar1);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_70);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(films,(auto_ptr_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_68);
  local_40 = films + 1;
  peVar1 = (element_type *)operator_new(0x20);
  local_8a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)peVar1,"Capital America",&local_89);
  local_8a = 0;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(&local_88,peVar1);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_88);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(films + 1,
           (auto_ptr_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )local_80);
  local_40 = films + 2;
  peVar1 = (element_type *)operator_new(0x20);
  local_a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)peVar1,"The spiderman",&local_a1);
  local_a2 = 0;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(&local_a0,peVar1);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_a0);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(films + 2,
           (auto_ptr_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )local_98);
  local_40 = films + 3;
  peVar1 = (element_type *)operator_new(0x20);
  pwin._M_ptr._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)peVar1,"The superman",(allocator *)((long)&pwin._M_ptr + 7));
  pwin._M_ptr._6_1_ = 0;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr((auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_b8,peVar1);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref(local_b8);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr(films + 3,
           (auto_ptr_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )local_b0);
  pwin._M_ptr._5_1_ = 0;
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr((auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&pwin._M_ptr + 7));
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr(&local_50);
  std::allocator<char>::~allocator((allocator<char> *)local_5d);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  auto_ptr((auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&stack0xffffffffffffff38,(element_type *)0x0);
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=((auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffff38,films + 1);
  std::operator<<((ostream *)&std::cout,"The mavel movies are:\n");
  for (local_cc = 0; local_cc < 5; local_cc = local_cc + 1) {
    peVar1 = std::
             auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(films + (long)local_cc + -1);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)peVar1);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"The winner is ");
  peVar1 = std::
           auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stack0xffffffffffffff38);
  poVar2 = std::operator<<(poVar2,(string *)peVar1);
  std::operator<<(poVar2,"!\n");
  std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~auto_ptr((auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffff38);
  local_1b0 = films + 4;
  do {
    local_1b0 = local_1b0 + -1;
    std::auto_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~auto_ptr(local_1b0);
  } while (local_1b0 != &local_38);
  return;
}

Assistant:

void why_not_use_auto_pointer() {
    using namespace std;

    auto_ptr<string> films[5] = {
            auto_ptr<string>(new string("The Iron Man")),
            auto_ptr<string>(new string("The amazing four")),
            auto_ptr<string>(new string("Capital America")),
            auto_ptr<string>(new string("The spiderman")),
            auto_ptr<string>(new string("The superman")),
    };

    //  when dispose, these two auto pointer will both try to free same memory on heap
    auto_ptr<string> pwin;
    pwin = films[2];  // film[2] lose owner ship， point to a null pointer

    std::cout << "The mavel movies are:\n";
    for (int i = 0; i < 5; i++) {
        std::cout << *films[i] << std::endl;
    }
    std::cout << "The winner is " << *pwin << "!\n";
//    cin.get();
}